

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O2

ParsedSchemaList * __thiscall
capnp::ParsedSchema::getAllNested(ParsedSchemaList *__return_storage_ptr__,ParsedSchema *this)

{
  RawBrandedSchema *pRVar1;
  SchemaParser *pSVar2;
  Reader local_48;
  
  pRVar1 = (this->super_Schema).raw;
  pSVar2 = this->parser;
  Schema::getProto(&local_48,&this->super_Schema);
  capnp::schema::Node::Reader::getNestedNodes(&__return_storage_ptr__->list,&local_48);
  (__return_storage_ptr__->parent).super_Schema.raw = pRVar1;
  (__return_storage_ptr__->parent).parser = pSVar2;
  return __return_storage_ptr__;
}

Assistant:

ParsedSchema::ParsedSchemaList ParsedSchema::getAllNested() const {
  return ParsedSchemaList(*this, getProto().getNestedNodes());
}